

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O2

void __thiscall jpge::jpeg_encoder::compute_quant_table(jpeg_encoder *this,int32 *pDst,int16 *pSrc)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = (this->m_params).m_quality;
  if (iVar1 < 0x32) {
    iVar1 = (int)(5000 / (long)iVar1);
  }
  else {
    iVar1 = iVar1 * -2 + 200;
  }
  for (lVar3 = 0; (int)lVar3 != 0x40; lVar3 = lVar3 + 1) {
    iVar2 = (int)(((long)pSrc[lVar3] * (long)iVar1 + 0x32) / 100);
    if (iVar2 < 2) {
      iVar2 = 1;
    }
    if (0xfe < iVar2) {
      iVar2 = 0xff;
    }
    pDst[lVar3] = iVar2;
  }
  return;
}

Assistant:

void jpeg_encoder::compute_quant_table(int32* pDst, int16* pSrc)
	{
		int32 q;
		if (m_params.m_quality < 50)
			q = 5000 / m_params.m_quality;
		else
			q = 200 - m_params.m_quality * 2;
		for (int i = 0; i < 64; i++)
		{
			int32 j = *pSrc++; j = (j * q + 50L) / 100L;
			*pDst++ = JPGE_MIN(JPGE_MAX(j, 1), 255);
		}
	}